

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O0

uc_err reg_read_ppc(void *_env,int mode,uint regid,void *value,size_t *size)

{
  uint local_44;
  int local_40;
  uint32_t val;
  int i;
  uc_err ret;
  CPUPPCState *env;
  size_t *size_local;
  void *value_local;
  uint regid_local;
  int mode_local;
  void *_env_local;
  
  val = 0xf;
  if ((regid < 2) || (0x21 < regid)) {
    if ((regid < 0x2a) || (0x49 < regid)) {
      if ((regid < 0x22) || (0x29 < regid)) {
        if (regid == 1) {
          if (*size < 4) {
            return UC_ERR_OVERFLOW;
          }
          *size = 4;
          val = 0;
          *(undefined4 *)value = *(undefined4 *)((long)_env + 0x160);
        }
        else if (regid == 0x4a) {
          if (*size < 4) {
            return UC_ERR_OVERFLOW;
          }
          *size = 4;
          val = 0;
          *(undefined4 *)value = *(undefined4 *)((long)_env + 0x100);
        }
        else if (regid == 0x4b) {
          if (*size < 4) {
            return UC_ERR_OVERFLOW;
          }
          *size = 4;
          val = 0;
          *(undefined4 *)value = *(undefined4 *)((long)_env + 0x128);
        }
        else if (regid == 0x4c) {
          if (*size < 4) {
            return UC_ERR_OVERFLOW;
          }
          *size = 4;
          val = 0;
          *(undefined4 *)value = *(undefined4 *)((long)_env + 0x104);
        }
        else if (regid == 0x4d) {
          if (*size < 4) {
            return UC_ERR_OVERFLOW;
          }
          *size = 4;
          val = 0;
          *(undefined4 *)value = *(undefined4 *)((long)_env + 0x14c);
        }
        else if (regid == 0x4e) {
          if (*size < 4) {
            return UC_ERR_OVERFLOW;
          }
          *size = 4;
          val = 0;
          *(undefined4 *)value = *(undefined4 *)((long)_env + 0x116ec);
        }
        else if (regid == 0x4f) {
          if (*size < 4) {
            return UC_ERR_OVERFLOW;
          }
          *size = 4;
          val = 0;
          local_44 = 0;
          for (local_40 = 0; local_40 < 8; local_40 = local_40 + 1) {
            local_44 = *(uint *)((long)_env + (long)local_40 * 4 + 0x108) | local_44 << 4;
          }
          *(uint *)value = local_44;
        }
      }
      else {
        if (*size < 4) {
          return UC_ERR_OVERFLOW;
        }
        *size = 4;
        val = 0;
        *(undefined4 *)value = *(undefined4 *)((long)_env + (ulong)(regid - 0x22) * 4 + 0x108);
      }
    }
    else {
      if (*size < 8) {
        return UC_ERR_OVERFLOW;
      }
      *size = 8;
      val = 0;
      *(undefined8 *)value = *(undefined8 *)((long)_env + (ulong)(regid - 0x2a) * 0x10 + 0x112c8);
    }
  }
  else {
    if (*size < 4) {
      return UC_ERR_OVERFLOW;
    }
    *size = 4;
    val = 0;
    *(undefined4 *)value = *(undefined4 *)((long)_env + (ulong)(regid - 2) * 4);
  }
  return val;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_read(void *_env, int mode, unsigned int regid, void *value,
                size_t *size)
{
    CPUPPCState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_PPC_REG_0 && regid <= UC_PPC_REG_31) {
        CHECK_REG_TYPE(ppcreg_t);
        *(ppcreg_t *)value = env->gpr[regid - UC_PPC_REG_0];
    } else if (regid >= UC_PPC_REG_FPR0 && regid <= UC_PPC_REG_FPR31) {
        CHECK_REG_TYPE(uint64_t);
        *(uint64_t *)value = env->vsr[regid - UC_PPC_REG_FPR0].VsrD(0);
    } else if (regid >= UC_PPC_REG_CR0 && regid <= UC_PPC_REG_CR7) {
        CHECK_REG_TYPE(uint32_t);
        *(uint32_t *)value = env->crf[regid - UC_PPC_REG_CR0];
    } else {
        switch (regid) {
        default:
            break;
        case UC_PPC_REG_PC:
            CHECK_REG_TYPE(ppcreg_t);
            *(ppcreg_t *)value = env->nip;
            break;
        case UC_PPC_REG_CR: {
            CHECK_REG_TYPE(uint32_t);
            int i;
            uint32_t val = 0;
            for (i = 0; i < 8; i++) {
                val <<= 4;
                val |= env->crf[i];
            }
            *(uint32_t *)value = val;
            break;
        }
        case UC_PPC_REG_LR:
            CHECK_REG_TYPE(ppcreg_t);
            *(ppcreg_t *)value = env->lr;
            break;
        case UC_PPC_REG_CTR:
            CHECK_REG_TYPE(ppcreg_t);
            *(ppcreg_t *)value = env->ctr;
            break;
        case UC_PPC_REG_MSR:
            CHECK_REG_TYPE(ppcreg_t);
            *(ppcreg_t *)value = env->msr;
            break;
        case UC_PPC_REG_XER:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = env->xer;
            break;
        case UC_PPC_REG_FPSCR:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = env->fpscr;
            break;
        }
    }

    return ret;
}